

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O1

int __thiscall
embree::BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
          (BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  float *pfVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  fVar18 = *(float *)(ctx + 0xd0);
  fVar19 = *(float *)(ctx + 0xd4);
  fVar20 = *(float *)(ctx + 0xd8);
  fVar21 = *(float *)(ctx + 0xdc);
  this->v[1][1].field_0.m128[0] = fVar18;
  this->v[1][1].field_0.m128[1] = fVar19;
  this->v[1][1].field_0.m128[2] = fVar20;
  this->v[1][1].field_0.m128[3] = fVar21;
  fVar14 = *(float *)(ctx + 0x410);
  fVar15 = *(float *)(ctx + 0x414);
  fVar16 = *(float *)(ctx + 0x418);
  fVar17 = *(float *)(ctx + 0x41c);
  this->v[1][2].field_0.m128[0] = fVar14;
  this->v[1][2].field_0.m128[1] = fVar15;
  this->v[1][2].field_0.m128[2] = fVar16;
  this->v[1][2].field_0.m128[3] = fVar17;
  fVar4 = *(float *)(ctx + 0x750);
  fVar5 = *(float *)(ctx + 0x754);
  fVar6 = *(float *)(ctx + 0x758);
  fVar7 = *(float *)(ctx + 0x75c);
  this->v[2][2].field_0.m128[0] = fVar4;
  this->v[2][2].field_0.m128[1] = fVar5;
  this->v[2][2].field_0.m128[2] = fVar6;
  this->v[2][2].field_0.m128[3] = fVar7;
  fVar8 = *(float *)(ctx + 0xa90);
  fVar9 = *(float *)(ctx + 0xa94);
  fVar10 = *(float *)(ctx + 0xa98);
  fVar11 = *(float *)(ctx + 0xa9c);
  this->v[2][1].field_0.m128[0] = fVar8;
  this->v[2][1].field_0.m128[1] = fVar9;
  this->v[2][1].field_0.m128[2] = fVar10;
  this->v[2][1].field_0.m128[3] = fVar11;
  if ((ulong)*(uint *)(ctx + 8) - 2 == (long)*(int *)ctx) {
    this->v[0][1].field_0.m128[0] = (fVar18 + fVar18) - fVar8;
    this->v[0][1].field_0.m128[1] = (fVar19 + fVar19) - fVar9;
    this->v[0][1].field_0.m128[2] = (fVar20 + fVar20) - fVar10;
    this->v[0][1].field_0.m128[3] = (fVar21 + fVar21) - fVar11;
    fVar22 = (fVar14 + fVar14) - fVar4;
    fVar23 = (fVar15 + fVar15) - fVar5;
    fVar24 = (fVar16 + fVar16) - fVar6;
    fVar25 = (fVar17 + fVar17) - fVar7;
  }
  else {
    puVar1 = (undefined8 *)(*(long *)(ctx + 0x300) + -0x20 + (ulong)*(uint *)(ctx + 8) * 0x10);
    uVar12 = puVar1[1];
    *(undefined8 *)&this->v[0][1].field_0 = *puVar1;
    *(undefined8 *)((long)&this->v[0][1].field_0 + 8) = uVar12;
    pfVar2 = (float *)(*(long *)(ctx + 0x300) + -0x10 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[0][2].field_0.m128[0] = fVar22;
  this->v[0][2].field_0.m128[1] = fVar23;
  this->v[0][2].field_0.m128[2] = fVar24;
  this->v[0][2].field_0.m128[3] = fVar25;
  if ((ulong)*(uint *)(ctx + 0x348) - 2 == (long)*(int *)(ctx + 0x340)) {
    this->v[1][3].field_0.m128[0] = (fVar14 + fVar14) - fVar18;
    this->v[1][3].field_0.m128[1] = (fVar15 + fVar15) - fVar19;
    this->v[1][3].field_0.m128[2] = (fVar16 + fVar16) - fVar20;
    this->v[1][3].field_0.m128[3] = (fVar17 + fVar17) - fVar21;
    fVar22 = (fVar4 + fVar4) - fVar8;
    fVar23 = (fVar5 + fVar5) - fVar9;
    fVar24 = (fVar6 + fVar6) - fVar10;
    fVar25 = (fVar7 + fVar7) - fVar11;
  }
  else {
    puVar1 = (undefined8 *)(*(long *)(ctx + 0x640) + -0x20 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    uVar12 = puVar1[1];
    *(undefined8 *)&this->v[1][3].field_0 = *puVar1;
    *(undefined8 *)((long)&this->v[1][3].field_0 + 8) = uVar12;
    pfVar2 = (float *)(*(long *)(ctx + 0x640) + -0x10 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[2][3].field_0.m128[0] = fVar22;
  this->v[2][3].field_0.m128[1] = fVar23;
  this->v[2][3].field_0.m128[2] = fVar24;
  this->v[2][3].field_0.m128[3] = fVar25;
  if ((ulong)*(uint *)(ctx + 0x688) - 2 == (long)*(int *)(ctx + 0x680)) {
    this->v[3][2].field_0.m128[0] = (fVar4 + fVar4) - fVar14;
    this->v[3][2].field_0.m128[1] = (fVar5 + fVar5) - fVar15;
    this->v[3][2].field_0.m128[2] = (fVar6 + fVar6) - fVar16;
    this->v[3][2].field_0.m128[3] = (fVar7 + fVar7) - fVar17;
    fVar22 = (fVar8 + fVar8) - fVar18;
    fVar23 = (fVar9 + fVar9) - fVar19;
    fVar24 = (fVar10 + fVar10) - fVar20;
    fVar25 = (fVar11 + fVar11) - fVar21;
  }
  else {
    puVar1 = (undefined8 *)(*(long *)(ctx + 0x980) + -0x20 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    uVar12 = puVar1[1];
    *(undefined8 *)&this->v[3][2].field_0 = *puVar1;
    *(undefined8 *)((long)&this->v[3][2].field_0 + 8) = uVar12;
    pfVar2 = (float *)(*(long *)(ctx + 0x980) + -0x10 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[3][1].field_0.m128[0] = fVar22;
  this->v[3][1].field_0.m128[1] = fVar23;
  this->v[3][1].field_0.m128[2] = fVar24;
  this->v[3][1].field_0.m128[3] = fVar25;
  if ((ulong)*(uint *)(ctx + 0x9c8) - 2 == (long)*(int *)(ctx + 0x9c0)) {
    this->v[2][0].field_0.m128[0] = (fVar8 + fVar8) - fVar4;
    this->v[2][0].field_0.m128[1] = (fVar9 + fVar9) - fVar5;
    this->v[2][0].field_0.m128[2] = (fVar10 + fVar10) - fVar6;
    this->v[2][0].field_0.m128[3] = (fVar11 + fVar11) - fVar7;
    fVar22 = (fVar18 + fVar18) - fVar14;
    fVar23 = (fVar19 + fVar19) - fVar15;
    fVar24 = (fVar20 + fVar20) - fVar16;
    fVar25 = (fVar21 + fVar21) - fVar17;
  }
  else {
    puVar1 = (undefined8 *)(*(long *)(ctx + 0xcc0) + -0x20 + (ulong)*(uint *)(ctx + 0x9c8) * 0x10);
    uVar12 = puVar1[1];
    *(undefined8 *)&this->v[2][0].field_0 = *puVar1;
    *(undefined8 *)((long)&this->v[2][0].field_0 + 8) = uVar12;
    pfVar2 = (float *)(*(long *)(ctx + 0xcc0) + -0x10 + (ulong)*(uint *)(ctx + 0x9c8) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[1][0].field_0.m128[0] = fVar22;
  this->v[1][0].field_0.m128[1] = fVar23;
  this->v[1][0].field_0.m128[2] = fVar24;
  this->v[1][0].field_0.m128[3] = fVar25;
  iVar3 = *(int *)ctx;
  if ((ulong)*(uint *)(ctx + 8) - 2 == (long)iVar3) {
    if (iVar3 == 2) {
      fVar22 = fVar14 + fVar8;
      fVar23 = fVar15 + fVar9;
      fVar24 = fVar16 + fVar10;
      fVar25 = fVar17 + fVar11;
      if ((*(uint *)(ctx + 0xc) & 0x7fffffff) == 0x7f800000) {
        fVar22 = fVar18 * 4.0 - (fVar22 + fVar22);
        fVar23 = fVar19 * 4.0 - (fVar23 + fVar23);
        fVar24 = fVar20 * 4.0 - (fVar24 + fVar24);
        fVar25 = fVar21 * 4.0 - (fVar25 + fVar25);
      }
      else {
        fVar22 = fVar22 * 4.0 + fVar18 * -8.0;
        fVar23 = fVar23 * 4.0 + fVar19 * -8.0;
        fVar24 = fVar24 * 4.0 + fVar20 * -8.0;
        fVar25 = fVar25 * 4.0 + fVar21 * -8.0;
      }
      fVar22 = fVar22 + fVar4;
      fVar23 = fVar23 + fVar5;
      fVar24 = fVar24 + fVar6;
      fVar25 = fVar25 + fVar7;
    }
    else {
      fVar22 = this->v[1][0].field_0.m128[0];
      fVar23 = this->v[1][0].field_0.m128[1];
      fVar24 = this->v[1][0].field_0.m128[2];
      fVar25 = this->v[1][0].field_0.m128[3];
      fVar22 = (fVar22 + fVar22) - this->v[2][0].field_0.m128[0];
      fVar23 = (fVar23 + fVar23) - this->v[2][0].field_0.m128[1];
      fVar24 = (fVar24 + fVar24) - this->v[2][0].field_0.m128[2];
      fVar25 = (fVar25 + fVar25) - this->v[2][0].field_0.m128[3];
    }
  }
  else if (iVar3 == 2) {
    fVar22 = this->v[0][1].field_0.m128[0];
    fVar23 = this->v[0][1].field_0.m128[1];
    fVar24 = this->v[0][1].field_0.m128[2];
    fVar25 = this->v[0][1].field_0.m128[3];
    fVar22 = (fVar22 + fVar22) - this->v[0][2].field_0.m128[0];
    fVar23 = (fVar23 + fVar23) - this->v[0][2].field_0.m128[1];
    fVar24 = (fVar24 + fVar24) - this->v[0][2].field_0.m128[2];
    fVar25 = (fVar25 + fVar25) - this->v[0][2].field_0.m128[3];
  }
  else {
    pfVar2 = (float *)(*(long *)(ctx + 0x300) + -0x30 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[0][0].field_0.m128[0] = fVar22;
  this->v[0][0].field_0.m128[1] = fVar23;
  this->v[0][0].field_0.m128[2] = fVar24;
  this->v[0][0].field_0.m128[3] = fVar25;
  iVar3 = *(int *)(ctx + 0x340);
  if ((ulong)*(uint *)(ctx + 0x348) - 2 == (long)iVar3) {
    if (iVar3 == 2) {
      fVar22 = fVar18 + fVar4;
      fVar23 = fVar19 + fVar5;
      fVar24 = fVar20 + fVar6;
      fVar25 = fVar21 + fVar7;
      if ((*(uint *)(ctx + 0x34c) & 0x7fffffff) == 0x7f800000) {
        fVar22 = fVar14 * 4.0 - (fVar22 + fVar22);
        fVar23 = fVar15 * 4.0 - (fVar23 + fVar23);
        fVar24 = fVar16 * 4.0 - (fVar24 + fVar24);
        fVar25 = fVar17 * 4.0 - (fVar25 + fVar25);
      }
      else {
        fVar22 = fVar22 * 4.0 + fVar14 * -8.0;
        fVar23 = fVar23 * 4.0 + fVar15 * -8.0;
        fVar24 = fVar24 * 4.0 + fVar16 * -8.0;
        fVar25 = fVar25 * 4.0 + fVar17 * -8.0;
      }
      fVar22 = fVar22 + fVar8;
      fVar23 = fVar23 + fVar9;
      fVar24 = fVar24 + fVar10;
      fVar25 = fVar25 + fVar11;
    }
    else {
      fVar22 = this->v[0][2].field_0.m128[0];
      fVar23 = this->v[0][2].field_0.m128[1];
      fVar24 = this->v[0][2].field_0.m128[2];
      fVar25 = this->v[0][2].field_0.m128[3];
      fVar22 = (fVar22 + fVar22) - this->v[0][1].field_0.m128[0];
      fVar23 = (fVar23 + fVar23) - this->v[0][1].field_0.m128[1];
      fVar24 = (fVar24 + fVar24) - this->v[0][1].field_0.m128[2];
      fVar25 = (fVar25 + fVar25) - this->v[0][1].field_0.m128[3];
    }
  }
  else if (iVar3 == 2) {
    fVar22 = this->v[1][3].field_0.m128[0];
    fVar23 = this->v[1][3].field_0.m128[1];
    fVar24 = this->v[1][3].field_0.m128[2];
    fVar25 = this->v[1][3].field_0.m128[3];
    fVar22 = (fVar22 + fVar22) - this->v[2][3].field_0.m128[0];
    fVar23 = (fVar23 + fVar23) - this->v[2][3].field_0.m128[1];
    fVar24 = (fVar24 + fVar24) - this->v[2][3].field_0.m128[2];
    fVar25 = (fVar25 + fVar25) - this->v[2][3].field_0.m128[3];
  }
  else {
    pfVar2 = (float *)(*(long *)(ctx + 0x640) + -0x30 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[0][3].field_0.m128[0] = fVar22;
  this->v[0][3].field_0.m128[1] = fVar23;
  this->v[0][3].field_0.m128[2] = fVar24;
  this->v[0][3].field_0.m128[3] = fVar25;
  iVar3 = *(int *)(ctx + 0x680);
  if ((ulong)*(uint *)(ctx + 0x688) - 2 == (long)iVar3) {
    if (iVar3 == 2) {
      fVar22 = fVar14 + fVar8;
      fVar23 = fVar15 + fVar9;
      fVar24 = fVar16 + fVar10;
      fVar25 = fVar17 + fVar11;
      if ((*(uint *)(ctx + 0x68c) & 0x7fffffff) == 0x7f800000) {
        fVar22 = fVar4 * 4.0 - (fVar22 + fVar22);
        fVar23 = fVar5 * 4.0 - (fVar23 + fVar23);
        fVar24 = fVar6 * 4.0 - (fVar24 + fVar24);
        fVar25 = fVar7 * 4.0 - (fVar25 + fVar25);
      }
      else {
        fVar22 = fVar22 * 4.0 + fVar4 * -8.0;
        fVar23 = fVar23 * 4.0 + fVar5 * -8.0;
        fVar24 = fVar24 * 4.0 + fVar6 * -8.0;
        fVar25 = fVar25 * 4.0 + fVar7 * -8.0;
      }
      fVar22 = fVar22 + fVar18;
      fVar23 = fVar23 + fVar19;
      fVar24 = fVar24 + fVar20;
      fVar25 = fVar25 + fVar21;
    }
    else {
      fVar22 = this->v[2][3].field_0.m128[0];
      fVar23 = this->v[2][3].field_0.m128[1];
      fVar24 = this->v[2][3].field_0.m128[2];
      fVar25 = this->v[2][3].field_0.m128[3];
      fVar22 = (fVar22 + fVar22) - this->v[1][3].field_0.m128[0];
      fVar23 = (fVar23 + fVar23) - this->v[1][3].field_0.m128[1];
      fVar24 = (fVar24 + fVar24) - this->v[1][3].field_0.m128[2];
      fVar25 = (fVar25 + fVar25) - this->v[1][3].field_0.m128[3];
    }
  }
  else if (iVar3 == 2) {
    fVar22 = this->v[3][2].field_0.m128[0];
    fVar23 = this->v[3][2].field_0.m128[1];
    fVar24 = this->v[3][2].field_0.m128[2];
    fVar25 = this->v[3][2].field_0.m128[3];
    fVar22 = (fVar22 + fVar22) - this->v[3][1].field_0.m128[0];
    fVar23 = (fVar23 + fVar23) - this->v[3][1].field_0.m128[1];
    fVar24 = (fVar24 + fVar24) - this->v[3][1].field_0.m128[2];
    fVar25 = (fVar25 + fVar25) - this->v[3][1].field_0.m128[3];
  }
  else {
    pfVar2 = (float *)(*(long *)(ctx + 0x980) + -0x30 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar22 = *pfVar2;
    fVar23 = pfVar2[1];
    fVar24 = pfVar2[2];
    fVar25 = pfVar2[3];
  }
  this->v[3][3].field_0.m128[0] = fVar22;
  this->v[3][3].field_0.m128[1] = fVar23;
  this->v[3][3].field_0.m128[2] = fVar24;
  this->v[3][3].field_0.m128[3] = fVar25;
  iVar3 = *(int *)(ctx + 0x9c0);
  uVar13 = (ulong)*(uint *)(ctx + 0x9c8);
  if (uVar13 - 2 == (long)iVar3) {
    if (iVar3 == 2) {
      uVar13 = (ulong)(*(uint *)(ctx + 0x9cc) & 0x7fffffff);
      fVar18 = fVar18 + fVar4;
      fVar19 = fVar19 + fVar5;
      fVar20 = fVar20 + fVar6;
      fVar21 = fVar21 + fVar7;
      if ((*(uint *)(ctx + 0x9cc) & 0x7fffffff) == 0x7f800000) {
        fVar18 = fVar8 * 4.0 - (fVar18 + fVar18);
        fVar19 = fVar9 * 4.0 - (fVar19 + fVar19);
        fVar20 = fVar10 * 4.0 - (fVar20 + fVar20);
        fVar21 = fVar11 * 4.0 - (fVar21 + fVar21);
      }
      else {
        fVar18 = fVar8 * -8.0 + fVar18 * 4.0;
        fVar19 = fVar9 * -8.0 + fVar19 * 4.0;
        fVar20 = fVar10 * -8.0 + fVar20 * 4.0;
        fVar21 = fVar11 * -8.0 + fVar21 * 4.0;
      }
      fVar14 = fVar14 + fVar18;
      fVar15 = fVar15 + fVar19;
      fVar16 = fVar16 + fVar20;
      fVar17 = fVar17 + fVar21;
    }
    else {
      fVar18 = this->v[3][1].field_0.m128[0];
      fVar19 = this->v[3][1].field_0.m128[1];
      fVar20 = this->v[3][1].field_0.m128[2];
      fVar21 = this->v[3][1].field_0.m128[3];
      fVar14 = (fVar18 + fVar18) - this->v[3][2].field_0.m128[0];
      fVar15 = (fVar19 + fVar19) - this->v[3][2].field_0.m128[1];
      fVar16 = (fVar20 + fVar20) - this->v[3][2].field_0.m128[2];
      fVar17 = (fVar21 + fVar21) - this->v[3][2].field_0.m128[3];
    }
  }
  else if (iVar3 == 2) {
    fVar18 = this->v[2][0].field_0.m128[0];
    fVar19 = this->v[2][0].field_0.m128[1];
    fVar20 = this->v[2][0].field_0.m128[2];
    fVar21 = this->v[2][0].field_0.m128[3];
    fVar14 = (fVar18 + fVar18) - this->v[1][0].field_0.m128[0];
    fVar15 = (fVar19 + fVar19) - this->v[1][0].field_0.m128[1];
    fVar16 = (fVar20 + fVar20) - this->v[1][0].field_0.m128[2];
    fVar17 = (fVar21 + fVar21) - this->v[1][0].field_0.m128[3];
  }
  else {
    uVar13 = uVar13 * 0x10;
    pfVar2 = (float *)(*(long *)(ctx + 0xcc0) + -0x30 + uVar13);
    fVar14 = *pfVar2;
    fVar15 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar17 = pfVar2[3];
  }
  this->v[3][0].field_0.m128[0] = fVar14;
  this->v[3][0].field_0.m128[1] = fVar15;
  this->v[3][0].field_0.m128[2] = fVar16;
  this->v[3][0].field_0.m128[3] = fVar17;
  return (int)uVar13;
}

Assistant:

__forceinline Vec3fa& operator =( const Vec3fa& other ) { m128 = other.m128; return *this; }